

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall GEO::Logger::is_client(Logger *this,LoggerClient *c)

{
  bool bVar1;
  _Self local_40 [3];
  SmartPointer<GEO::LoggerClient> local_28;
  _Self local_20;
  LoggerClient *local_18;
  LoggerClient *c_local;
  Logger *this_local;
  
  local_18 = c;
  c_local = (LoggerClient *)this;
  SmartPointer<GEO::LoggerClient>::SmartPointer(&local_28,c);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
       ::find(&this->clients_,&local_28);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
       ::end(&this->clients_);
  bVar1 = std::operator!=(&local_20,local_40);
  SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_28);
  return bVar1;
}

Assistant:

bool Logger::is_client(LoggerClient* c) const {
        return clients_.find(c) != clients_.end();
    }